

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

MCALabelSubDescriptor * __thiscall
ASDCP::MXF::MCALabelSubDescriptor::InitFromTLVSet(MCALabelSubDescriptor *this,TLVReader *TLVSet)

{
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_MCALabelSubDescriptor_MCALabelDictionaryID);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
        pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_MCALabelSubDescriptor_MCALinkID);
        TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
          pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_MCALabelSubDescriptor_MCATagSymbol);
          TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
            pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                      MDD_MCALabelSubDescriptor_MCATagName);
            TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket;
            *(bool *)&TLVSet[4].m_ElementMap._M_t._M_impl = iVar1 == Kumu::RESULT_OK;
            if (-1 < iVar1) {
              pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                        MDD_MCALabelSubDescriptor_MCAChannelID);
              TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar2);
              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
              Kumu::Result_t::~Result_t((Result_t *)&local_80);
              iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket;
              TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 =
                   iVar1 == Kumu::RESULT_OK;
              if (-1 < iVar1) {
                pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                          MDD_MCALabelSubDescriptor_RFC5646SpokenLanguage);
                TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                Kumu::Result_t::~Result_t((Result_t *)&local_80);
                iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket;
                *(bool *)&TLVSet[5].super_MemIOReader.m_p = iVar1 == Kumu::RESULT_OK;
                if (-1 < iVar1) {
                  pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                            MDD_MCALabelSubDescriptor_MCATitle);
                  TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                  Kumu::Result_t::~Result_t((Result_t *)&local_80);
                  iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket;
                  *(bool *)&TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_right = iVar1 == Kumu::RESULT_OK;
                  if (-1 < iVar1) {
                    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                              MDD_MCALabelSubDescriptor_MCATitleVersion);
                    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                    Kumu::Result_t::~Result_t((Result_t *)&local_80);
                    iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket
                    ;
                    *(bool *)&TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_color = iVar1 == Kumu::RESULT_OK;
                    if (-1 < iVar1) {
                      pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                                MDD_MCALabelSubDescriptor_MCATitleSubVersion);
                      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                      Kumu::Result_t::~Result_t((Result_t *)&local_80);
                      iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket.
                                       _vptr_KLVPacket;
                      *(bool *)&TLVSet[7].super_MemIOReader.m_p = iVar1 == Kumu::RESULT_OK;
                      if (-1 < iVar1) {
                        pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                                  MDD_MCALabelSubDescriptor_MCAEpisode);
                        TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                        Kumu::Result_t::~Result_t((Result_t *)&local_80);
                        iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket.
                                         _vptr_KLVPacket;
                        *(bool *)&TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right = iVar1 == Kumu::RESULT_OK;
                        if (-1 < iVar1) {
                          pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                                    MDD_MCALabelSubDescriptor_MCAPartitionKind);
                          TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                          Kumu::Result_t::~Result_t((Result_t *)&local_80);
                          iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket.
                                           _vptr_KLVPacket;
                          *(bool *)&TLVSet[8].m_ElementMap._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_color = iVar1 == Kumu::RESULT_OK;
                          if (-1 < iVar1) {
                            pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                                      MDD_MCALabelSubDescriptor_MCAPartitionNumber);
                            TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                            Kumu::Result_t::~Result_t((Result_t *)&local_80);
                            iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket.
                                             _vptr_KLVPacket;
                            *(bool *)&TLVSet[9].super_MemIOReader.m_p = iVar1 == Kumu::RESULT_OK;
                            if (-1 < iVar1) {
                              pMVar2 = Dictionary::Type((Dictionary *)
                                                        TLVSet[1].super_MemIOReader.m_p,
                                                                                                                
                                                  MDD_MCALabelSubDescriptor_MCAAudioContentKind);
                              TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                              Kumu::Result_t::~Result_t((Result_t *)&local_80);
                              iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket.
                                               _vptr_KLVPacket;
                              *(bool *)&TLVSet[9].m_ElementMap._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_right = iVar1 == Kumu::RESULT_OK;
                              if (-1 < iVar1) {
                                pMVar2 = Dictionary::Type((Dictionary *)
                                                          TLVSet[1].super_MemIOReader.m_p,
                                                                                                                    
                                                  MDD_MCALabelSubDescriptor_MCAAudioElementKind);
                                TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
                                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                                Kumu::Result_t::~Result_t((Result_t *)&local_80);
                                *(bool *)&TLVSet[10].m_ElementMap._M_t._M_impl.super__Rb_tree_header
                                          ._M_header._M_color =
                                     *(int *)&(this->super_InterchangeObject).super_KLVPacket.
                                              _vptr_KLVPacket == Kumu::RESULT_OK;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xea7,
                "virtual ASDCP::Result_t ASDCP::MXF::MCALabelSubDescriptor::InitFromTLVSet(TLVReader &)"
               );
}

Assistant:

ASDCP::Result_t
MCALabelSubDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(MCALabelSubDescriptor, MCALabelDictionaryID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(MCALabelSubDescriptor, MCALinkID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(MCALabelSubDescriptor, MCATagSymbol));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCATagName));
    MCATagName.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi32(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAChannelID));
    MCAChannelID.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, RFC5646SpokenLanguage));
    RFC5646SpokenLanguage.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCATitle));
    MCATitle.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCATitleVersion));
    MCATitleVersion.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCATitleSubVersion));
    MCATitleSubVersion.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAEpisode));
    MCAEpisode.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAPartitionKind));
    MCAPartitionKind.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAPartitionNumber));
    MCAPartitionNumber.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAAudioContentKind));
    MCAAudioContentKind.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAAudioElementKind));
    MCAAudioElementKind.set_has_value( result == RESULT_OK );
  }
  return result;
}